

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

shared_ptr<duckdb::Pipeline,_true> __thiscall
duckdb::Executor::CreateChildPipeline(Executor *this,Pipeline *current,PhysicalOperator *op)

{
  pointer *pprVar1;
  pointer pLVar2;
  iterator __position;
  Pipeline *pPVar3;
  element_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer pLVar5;
  shared_ptr<duckdb::Pipeline,_true> sVar6;
  reference_wrapper<duckdb::PhysicalOperator> current_op;
  undefined1 local_39;
  shared_ptr<duckdb::Pipeline> local_38;
  
  local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::Pipeline,std::allocator<duckdb::Pipeline>,duckdb::Executor&>
            (&local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Pipeline **)&local_38,(allocator<duckdb::Pipeline> *)&local_39,(Executor *)current);
  shared_ptr<duckdb::Pipeline,_true>::shared_ptr
            ((shared_ptr<duckdb::Pipeline,_true> *)this,&local_38);
  if (local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)this);
  (pPVar3->sink).ptr = (PhysicalOperator *)op->estimated_cardinality;
  pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)this);
  (pPVar3->source).ptr = (PhysicalOperator *)in_RCX;
  pLVar5 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  _Var4._M_pi = extraout_RDX;
  if (pLVar5 != pLVar2) {
    do {
      local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)pLVar5;
      if (local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr == in_RCX
         ) break;
      pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator->
                         ((shared_ptr<duckdb::Pipeline,_true> *)this);
      __position._M_current =
           (pPVar3->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pPVar3->operators).
          super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>const&>
                  ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                    *)&pPVar3->operators,__position,
                   (reference_wrapper<duckdb::PhysicalOperator> *)&local_38);
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        (__position._M_current)->_M_data =
             (PhysicalOperator *)
             local_38.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pprVar1 = &(pPVar3->operators).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
        _Var4._M_pi = extraout_RDX_00;
      }
      pLVar5 = (pointer)&pLVar5->type_info_;
    } while (pLVar5 != pLVar2);
  }
  sVar6.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Pipeline,_true>)
         sVar6.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Pipeline> Executor::CreateChildPipeline(Pipeline &current, PhysicalOperator &op) {
	D_ASSERT(!current.operators.empty());
	D_ASSERT(op.IsSource());
	// found another operator that is a source, schedule a child pipeline
	// 'op' is the source, and the sink is the same
	auto child_pipeline = make_shared_ptr<Pipeline>(*this);
	child_pipeline->sink = current.sink;
	child_pipeline->source = &op;

	// the child pipeline has the same operators up until 'op'
	for (auto current_op : current.operators) {
		if (&current_op.get() == &op) {
			break;
		}
		child_pipeline->operators.push_back(current_op);
	}

	return child_pipeline;
}